

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_link(MIR_context_t ctx,_func_void_MIR_context_t_MIR_item_t *set_interface,
             _func_void_ptr_char_ptr *import_resolver)

{
  DLIST_MIR_insn_t *list;
  size_t *psVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  anon_union_32_12_57d33f68_for_u aVar5;
  undefined1 auVar6 [32];
  uint32_t uVar7;
  MIR_label_t func_item;
  undefined8 uVar8;
  MIR_label_t stop;
  VARR_MIR_op_t *varr;
  MIR_lref_data *pMVar9;
  VARR_uint8_t *pVVar10;
  MIR_func_t pMVar11;
  MIR_lref_data_t pMVar12;
  VARR_size_t *pVVar13;
  MIR_insn_t pMVar14;
  int *piVar15;
  VARR_MIR_var_t *pVVar16;
  MIR_expr_data_t pMVar17;
  VARR_MIR_module_t *pVVar18;
  MIR_item_t_conflict pMVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  MIR_op_t op1;
  MIR_op_t obj;
  undefined1 auVar22 [32];
  anon_union_32_12_57d33f68_for_u aVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  MIR_str_t MVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  MIR_op_t op2;
  MIR_op_t op1_00;
  bool bVar31;
  unkbyte10 Var32;
  undefined2 uVar33;
  uint extraout_EAX;
  uint uVar34;
  int iVar35;
  int iVar36;
  MIR_insn_code_t MVar37;
  MIR_reg_t MVar38;
  MIR_item_type_t MVar39;
  MIR_label_t pMVar40;
  MIR_insn_t pMVar41;
  void *addr;
  MIR_item_t pMVar42;
  MIR_insn_t_conflict pMVar43;
  int64_t iVar44;
  MIR_label_t pMVar45;
  MIR_label_t pMVar46;
  size_t sVar47;
  MIR_module_t_conflict pMVar48;
  MIR_type_t *pMVar49;
  simplify_ctx *psVar50;
  MIR_insn_t_conflict pMVar51;
  size_t sVar52;
  ulong uVar53;
  MIR_insn_t_conflict pMVar54;
  MIR_insn_t_conflict pMVar55;
  MIR_insn_t_conflict pMVar56;
  int *piVar57;
  MIR_insn_t_conflict pMVar58;
  DLIST_MIR_insn_t *pDVar59;
  uint uVar60;
  VARR_MIR_insn_t *extraout_RDX;
  VARR_MIR_insn_t *extraout_RDX_00;
  VARR_MIR_insn_t *extraout_RDX_01;
  VARR_MIR_insn_t *extraout_RDX_02;
  VARR_MIR_insn_t *pVVar61;
  MIR_func_t pMVar62;
  MIR_type_t MVar63;
  MIR_op_t *pMVar64;
  MIR_lref_data **ppMVar65;
  long lVar66;
  MIR_type_t MVar67;
  MIR_func_t pMVar68;
  MIR_context_t pMVar69;
  MIR_context_t pMVar70;
  char *pcVar71;
  DLIST_MIR_item_t *pDVar72;
  MIR_insn_t obj_00;
  MIR_insn_code_t MVar73;
  size_t i;
  ulong uVar74;
  MIR_label_t ix;
  ulong uVar75;
  bool bVar76;
  MIR_str_t MVar77;
  undefined1 in_ZMM1 [64];
  undefined1 auVar78 [64];
  int in_stack_fffffffffffff950;
  MIR_insn_t_conflict local_5f0;
  MIR_insn_t local_5e8;
  MIR_insn_t_conflict local_5e0;
  MIR_insn_t_conflict local_5d8;
  MIR_insn_t local_5d0;
  int func_top_alloca_used_p;
  int64_t alloca_size;
  MIR_insn_t_conflict local_5b8;
  MIR_insn_t local_5b0;
  uint local_5a4;
  int called_func_top_alloca_used_p;
  int non_top_alloca_p;
  MIR_var_t var;
  undefined8 uStack_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  int64_t align;
  undefined1 uStack_540;
  undefined1 uStack_53f;
  undefined6 uStack_53e;
  MIR_reg_t MStack_538;
  undefined4 uStack_534;
  char *pcStack_530;
  undefined8 uStack_528;
  MIR_disp_t MStack_520;
  anon_union_16_8_da7ae194 v;
  undefined1 local_508;
  undefined1 uStack_507;
  undefined2 uStack_506;
  undefined4 uStack_504;
  undefined2 uStack_500;
  _func_void_MIR_context_t_MIR_item_t *local_4f0;
  int64_t max_func_top_alloca_align;
  MIR_reg_t local_4dc;
  MIR_op_t op;
  MIR_type_t *local_4a0;
  int64_t max_align;
  undefined1 uStack_490;
  undefined1 uStack_48f;
  undefined6 uStack_48e;
  MIR_reg_t MStack_488;
  undefined4 uStack_484;
  void *pvStack_480;
  MIR_op_t op_2;
  MIR_op_t op_1;
  int64_t alloca_align;
  MIR_op_t op_13;
  MIR_op_t op_12;
  undefined6 uStack_32e;
  undefined4 uStack_324;
  undefined8 uStack_320;
  MIR_op_t op_25;
  MIR_op_t op_24;
  MIR_op_t op_23;
  MIR_op_t op_22;
  MIR_op_t op_21;
  MIR_op_t op_20;
  MIR_op_t op_19;
  MIR_op_t op_18;
  MIR_op_t op_17;
  MIR_op_t op_4;
  MIR_op_t op_15;
  MIR_op_t op_14;
  MIR_op_t op_11;
  MIR_op_t op_10;
  
  ix = (MIR_label_t)0x0;
  local_4f0 = set_interface;
  do {
    pMVar40 = (MIR_label_t)VARR_MIR_module_tlength(ctx->modules_to_link);
    if (pMVar40 <= ix) {
      uVar74 = 0;
      do {
        sVar47 = VARR_MIR_module_tlength(ctx->modules_to_link);
        if (sVar47 <= uVar74) {
          if (local_4f0 != (_func_void_MIR_context_t_MIR_item_t *)0x0) {
            while (sVar47 = VARR_MIR_module_tlength(ctx->modules_to_link), sVar47 != 0) {
              pVVar18 = ctx->modules_to_link;
              if (((pVVar18 == (VARR_MIR_module_t *)0x0) ||
                  (pVVar18->varr == (MIR_module_t_conflict *)0x0)) ||
                 (sVar47 = pVVar18->els_num, sVar47 == 0)) {
                mir_varr_assert_fail("pop","MIR_module_t");
              }
              pVVar18->els_num = sVar47 - 1;
              pDVar72 = &pVVar18->varr[sVar47 - 1]->items;
              while (pMVar19 = pDVar72->head, pMVar19 != (MIR_item_t_conflict)0x0) {
                if (pMVar19->item_type == MIR_func_item) {
                  (*local_4f0)(ctx,pMVar19);
                }
                pDVar72 = (DLIST_MIR_item_t *)&(pMVar19->item_link).next;
              }
            }
            (*local_4f0)(ctx,(MIR_item_t_conflict)0x0);
          }
          return;
        }
        pMVar69 = (MIR_context_t)ctx->modules_to_link;
        pMVar48 = VARR_MIR_module_tget((VARR_MIR_module_t *)pMVar69,uVar74);
        pDVar72 = &pMVar48->items;
        while (pMVar41 = (MIR_insn_t)pDVar72->head, pMVar41 != (MIR_insn_t)0x0) {
          MVar39 = *(MIR_item_type_t *)&pMVar41->ops[0].data;
          pMVar70 = pMVar69;
          if (MVar39 == MIR_ref_data_item) {
            pMVar12 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar41->ops[0].u + 0x10))->
                      lref_data;
            pMVar42 = pMVar12->label->ops[0].u.ref;
            if (pMVar42 == (MIR_item_t)0x0) {
              __assert_fail("item->u.ref_data->ref_item->addr != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x7d8,
                            "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                           );
            }
            pMVar12->orig_label->data =
                 (void *)((long)&pMVar12->label2->ops[0].data + (long)&pMVar42[-1].ref_def);
          }
          else {
            if (MVar39 == MIR_func_item) {
              if (pMVar41->data == (void *)0x0) goto LAB_00115a33;
              vn_empty(ctx);
              pMVar11 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar41->ops[0].u + 0x10))->func;
              list = &pMVar11->insns;
              local_4a0 = (MIR_type_t *)DLIST_MIR_insn_t_length(list);
              pMVar62 = pMVar11;
              local_5d8 = func_alloca_features
                                    (ctx,pMVar11,&func_top_alloca_used_p,(int *)0x0,&alloca_size);
              if (func_top_alloca_used_p != 0 && local_5d8 == (MIR_insn_t_conflict)0x0) {
                __assert_fail("func_top_alloca != ((void*)0) || !func_top_alloca_used_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0xfa2,"void process_inlines(MIR_context_t, MIR_item_t)");
              }
              max_func_top_alloca_align = 0;
              if (local_5d8 == (MIR_insn_t_conflict)0x0 || func_top_alloca_used_p == 0) {
                local_5d0 = (MIR_insn_t)0x0;
              }
              else {
                pMVar62 = (MIR_func_t)&max_func_top_alloca_align;
                local_5d0 = (MIR_insn_t)get_alloca_size_align(alloca_size,(int64_t *)pMVar62);
              }
              VARR_MIR_insn_ttrunc(ctx->simplify_ctx->anchors,(size_t)pMVar62);
              psVar50 = ctx->simplify_ctx;
              pVVar13 = psVar50->alloca_sizes;
              if ((pVVar13 == (VARR_size_t *)0x0) || (pVVar13->varr == (size_t *)0x0)) {
                pcVar71 = "trunc";
LAB_00115ae8:
                mir_varr_assert_fail(pcVar71,"size_t");
              }
              pVVar13->els_num = 0;
              VARR_MIR_insn_ttrunc(psVar50->cold_insns,(size_t)pMVar62);
              pMVar51 = (pMVar11->insns).head;
              pMVar49 = (MIR_type_t *)((ulong)((long)local_4a0 * 0x32) / 100);
              local_5e0 = (MIR_insn_t_conflict)0x0;
              if (pMVar49 < (MIR_type_t *)0xc9) {
                pMVar49 = (MIR_type_t *)0xc8;
              }
              local_5a4 = 200;
              local_5b0 = local_5d0;
              obj_00 = local_5d0;
              local_5b8 = pMVar51;
LAB_00114230:
              pMVar43 = pMVar51;
              psVar50 = ctx->simplify_ctx;
              if (pMVar43 != (MIR_insn_t_conflict)0x0) {
                auVar4._0_8_ = psVar50->inline_insns_before;
                auVar4._8_8_ = psVar50->inline_insns_after;
                auVar20 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                in_ZMM1 = ZEXT1664(auVar20);
                auVar20 = vpsubq_avx(auVar4,auVar20);
                psVar50->inline_insns_before = auVar20._0_8_;
                psVar50->inline_insns_after = auVar20._8_8_;
                while ((sVar47 = VARR_MIR_insn_tlength(psVar50->anchors), sVar47 != 0 &&
                       (pMVar51 = VARR_MIR_insn_tlast(ctx->simplify_ctx->anchors),
                       pMVar51 == pMVar43))) {
                  VARR_MIR_insn_tpop(ctx->simplify_ctx->anchors);
                  psVar50 = ctx->simplify_ctx;
                  pVVar13 = psVar50->alloca_sizes;
                  if ((pVVar13 == (VARR_size_t *)0x0) ||
                     ((pVVar13->varr == (size_t *)0x0 || (sVar47 = pVVar13->els_num, sVar47 == 0))))
                  {
                    pcVar71 = "pop";
                    goto LAB_00115ae8;
                  }
                  pVVar13->els_num = sVar47 - 1;
                  obj_00 = (MIR_insn_t)pVVar13->varr[sVar47 - 1];
                }
                pMVar51 = (pMVar43->insn_link).next;
                MVar73 = *(MIR_insn_code_t *)&pMVar43->field_0x18;
                if (MVar73 == MIR_LABEL) {
                  pMVar42 = (MIR_item_t)ctx->simplify_ctx->new_label_num;
                  ctx->simplify_ctx->new_label_num = (size_t)((long)&pMVar42->data + 1);
                  pMVar43->ops[0].u.ref = pMVar42;
                  MVar73 = *(MIR_insn_code_t *)&pMVar43->field_0x18;
                }
                if (0xfffffffc < MVar73 - MIR_SWITCH) {
                  if (*(char *)&pMVar43[1].insn_link.prev == '\b') {
                    pMVar64 = (MIR_op_t *)&pMVar43[1].insn_link;
                    while( true ) {
                      pMVar14 = *(MIR_insn_t *)&pMVar64->field_0x8;
                      if (pMVar14 == (MIR_insn_t)0x0) goto LAB_00114341;
                      MVar39 = *(MIR_item_type_t *)&pMVar14->ops[0].data;
                      if (2 < MVar39 - MIR_import_item) break;
                      pMVar64 = pMVar14->ops;
                    }
                    if (pMVar14 == pMVar41 || MVar39 != MIR_func_item) goto LAB_00114341;
                    pMVar62 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))
                              ->func;
                    pDVar59 = &pMVar62->insns;
                    sVar47 = DLIST_MIR_insn_t_length(pDVar59);
                    if (((pMVar62->first_lref == (MIR_lref_data *)0x0) &&
                        (pMVar62->vararg_p == '\0')) && (pMVar62->jret_p == '\0')) {
                      uVar53 = 200;
                      if (MVar73 == MIR_CALL) {
                        uVar53 = 0x32;
                      }
                      if ((sVar47 <= uVar53) && (local_4a0 <= pMVar49)) {
                        psVar1 = &ctx->simplify_ctx->inlined_calls;
                        *psVar1 = *psVar1 + 1;
                        pMVar14 = (pMVar43->insn_link).prev;
                        piVar15 = *(int **)(*(long *)((long)&(pMVar43->ops[0].u.label)->ops[0].u +
                                                     0x10) + 0x10);
                        if (pMVar51 == (MIR_insn_t)0x0) {
                          pMVar51 = MIR_new_label(ctx);
                          MIR_insert_insn_after(ctx,(MIR_item_t_conflict)pMVar41,pMVar43,pMVar51);
                        }
                        pMVar11->n_inlines = pMVar11->n_inlines + 1;
                        pVVar16 = pMVar62->vars;
                        sVar52 = VARR_MIR_var_tlength(pVVar16);
                        rename_regs(ctx,pMVar11,pMVar62,pVVar16,sVar52);
                        pVVar16 = pMVar62->global_vars;
                        if (pVVar16 == (VARR_MIR_var_t *)0x0) {
                          sVar52 = 0;
                        }
                        else {
                          sVar52 = pVVar16->els_num;
                        }
                        local_4a0 = (MIR_type_t *)((long)local_4a0 + sVar47);
                        rename_regs(ctx,pMVar11,pMVar62,pVVar16,sVar52);
                        uVar7 = pMVar62->nres;
                        uVar60 = pMVar62->nargs;
                        for (sVar47 = 0;
                            (uVar60 != sVar47 &&
                            ((uVar7 + 2) + sVar47 < (ulong)*(uint *)&pMVar43->field_0x1c));
                            sVar47 = sVar47 + 1) {
                          VARR_MIR_var_tget(&var,pMVar62->vars,sVar47);
                          MVar67 = var.type;
                          lVar66 = CONCAT44(var.size._4_4_,(MIR_reg_t)var.size);
                          MVar63 = MIR_T_I64;
                          if ((var.type & ~MIR_T_U8) == MIR_T_F) {
                            MVar63 = var.type;
                          }
                          if (var.type == MIR_T_LD) {
                            MVar63 = var.type;
                          }
                          MVar38 = MIR_reg(ctx,(char *)CONCAT62(var.name._2_6_,
                                                                CONCAT11(var.name._1_1_,
                                                                         (char)var.name)),pMVar62);
                          MVar38 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,(ulong)MVar38
                                                    );
                          if (0xfffffff9 < MVar63 - MIR_T_UNDEF) {
                            __assert_fail("!MIR_all_blk_type_p (type) || (op.mode == MIR_OP_MEM && type == MIR_T_I64)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0xfea,"void process_inlines(MIR_context_t, MIR_item_t)");
                          }
                          if (MVar67 - MIR_T_RBLK < 0xfffffffb) {
                            if (MVar67 == MIR_T_RBLK) {
                              local_5a4 = (local_5a4 & 0xffffff00) + 1;
                            }
                            MVar73 = MIR_FMOV;
                            if (MVar63 != MIR_T_F) {
                              if (MVar63 == MIR_T_D) {
                                MVar73 = MIR_DMOV;
                              }
                              else {
                                MVar73 = (uint)(MVar63 == MIR_T_LD) * 3;
                              }
                            }
                            auVar29._9_7_ = op_4._9_7_;
                            auVar29._0_9_ = (unkuint9)1 << 0x40;
                            in_stack_fffffffffffff950 = auVar29._8_4_;
                            in_ZMM1 = ZEXT1664(CONCAT124(op_4.u._4_12_,MVar38));
                            pMVar56 = MIR_new_insn(ctx,MVar73);
                            MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56)
                            ;
                          }
                          else {
                            uVar75 = lVar66 + 7;
                            local_5f0 = (MIR_insn_t_conflict)ctx->simplify_ctx->new_label_num;
                            pMVar68 = ((anon_union_8_10_166bea1d_for_u *)
                                      ((long)&pMVar41->ops[0].u + 0x10))->func;
                            var.size._0_4_ = new_temp_reg(ctx,MIR_T_I64,pMVar68);
                            var.name._0_1_ = '\x01';
                            var.name._1_1_ = 0;
                            var.type = MIR_T_I8;
                            var._4_4_ = 0;
                            uVar53 = uVar75 & 0xfffffffffffffff8;
                            uStack_540 = 3;
                            uStack_53f = 0;
                            align._0_4_ = 0;
                            align._4_4_ = 0;
                            MStack_538 = (MIR_reg_t)uVar53;
                            uStack_534 = (undefined4)(uVar53 >> 0x20);
                            pMVar56 = MIR_new_insn(ctx,MIR_MOV);
                            MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56)
                            ;
                            in_stack_fffffffffffff950 = (int)CONCAT62(uStack_32e,1);
                            in_ZMM1 = ZEXT1664(CONCAT88(uStack_320,CONCAT44(uStack_324,MVar38)));
                            pMVar56 = MIR_new_insn(ctx,MIR_ALLOCA);
                            MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56)
                            ;
                            if ((uVar75 & 0xfffffffffffffff8) != 0) {
                              local_4dc = new_temp_reg(ctx,MIR_T_I64,pMVar68);
                              uStack_490 = 1;
                              uStack_48f = 0;
                              max_align = 0;
                              MStack_488 = local_4dc;
                              op.u.reg = new_temp_reg(ctx,MIR_T_I64,pMVar68);
                              op._8_1_ = 1;
                              op._9_1_ = 0;
                              op.data = (void *)0x0;
                              new_temp_reg(ctx,MIR_T_I64,pMVar68);
                              MVar38 = new_temp_reg(ctx,MIR_T_I64,pMVar68);
                              op_2._8_1_ = 1;
                              op_2._9_1_ = 0;
                              op_2.data = (void *)0x0;
                              op_2.u.reg = MVar38;
                              lVar66 = (long)local_5f0 + 1;
                              pMVar56 = create_label(ctx,(int64_t)local_5f0);
                              local_5f0 = (MIR_insn_t_conflict)((long)local_5f0 + 2);
                              pMVar54 = create_label(ctx,lVar66);
                              pMVar55 = MIR_new_insn(ctx,MIR_MOV);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              pMVar55 = MIR_new_insn(ctx,MIR_BLE);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56);
                              pMVar55 = MIR_new_insn(ctx,MIR_ADD);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              MVar38 = local_4dc;
                              pMVar55 = MIR_new_insn(ctx,MIR_MOV);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              pMVar55 = MIR_new_insn(ctx,MIR_ADD);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              op_13._8_2_ = 10;
                              op_13.data = (void *)0x0;
                              op_13.u.reg._0_2_ = 0x106;
                              op_13.u.mem.disp = 0;
                              op_13.u.mem.base = MVar38;
                              op_13.u.mem.index = 0;
                              op_13.u.mem.nloc = 0;
                              op_13.u.mem.alias = 0;
                              op_13.u.mem.nonalias = 0;
                              pMVar55 = MIR_new_insn(ctx,MIR_MOV);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              pMVar55 = MIR_new_insn(ctx,MIR_MOV);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              pMVar55 = MIR_new_insn(ctx,MIR_ADD);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55);
                              auVar30._9_7_ = op_15._9_7_;
                              auVar30._0_9_ = (unkuint9)0xc << 0x40;
                              in_stack_fffffffffffff950 = auVar30._8_4_;
                              in_ZMM1 = ZEXT1664(CONCAT88(op_15.u.str.s,pMVar56));
                              pMVar56 = MIR_new_insn(ctx,MIR_BLT);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar54);
                            }
                            ctx->simplify_ctx->new_label_num = (size_t)local_5f0;
                          }
                        }
                        VARR_MIR_insn_tpush(ctx->simplify_ctx->anchors,pMVar51);
                        VARR_size_tpush(ctx->simplify_ctx->alloca_sizes,(size_t)obj_00);
                        pMVar56 = (MIR_insn_t_conflict)&alloca_size;
                        pMVar68 = pMVar62;
                        pMVar54 = func_alloca_features
                                            (ctx,pMVar62,&called_func_top_alloca_used_p,
                                             &non_top_alloca_p,(int64_t *)pMVar56);
                        if ((pMVar54 != (MIR_insn_t_conflict)0x0) &&
                           (called_func_top_alloca_used_p != 0)) {
                          alloca_size = get_alloca_size_align(alloca_size,&alloca_align);
                          if (max_func_top_alloca_align < alloca_align) {
                            lVar66 = (long)obj_00->ops + alloca_align + -0x21;
                            max_func_top_alloca_align = alloca_align;
                            obj_00 = (MIR_insn_t)(lVar66 - lVar66 % alloca_align);
                          }
                          obj_00 = (MIR_insn_t)((long)obj_00->ops + alloca_size + -0x20);
                          pMVar68 = (MIR_func_t)alloca_align;
                          if ((long)local_5d0 <= (long)obj_00) {
                            local_5d0 = obj_00;
                          }
                        }
                        VARR_MIR_insn_ttrunc(ctx->simplify_ctx->temp_insns,(size_t)pMVar68);
                        VARR_MIR_insn_ttrunc(ctx->simplify_ctx->labels,(size_t)pMVar68);
                        VARR_uint8_ttrunc(ctx->temp_data,(size_t)pMVar68);
                        pVVar61 = extraout_RDX;
                        if (non_top_alloca_p == 0) {
                          pMVar55 = (MIR_insn_t_conflict)&pMVar62->insns;
                          while( true ) {
                            pMVar55 = (pMVar55->insn_link).prev;
                            if (pMVar55 == (MIR_insn_t_conflict)0x0) {
                              __assert_fail("insn != ((void*)0)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                            ,0x1015,
                                            "void process_inlines(MIR_context_t, MIR_item_t)");
                            }
                            if (*(int *)&pMVar55->field_0x18 - 0xabU < 2) break;
                            psVar1 = &ctx->simplify_ctx->inline_insns_after;
                            *psVar1 = *psVar1 + 1;
                            pMVar58 = MIR_copy_insn(ctx,pMVar55);
                            change_inline_insn_regs(ctx,pMVar58);
                            store_labels_for_duplication
                                      ((MIR_context_t)ctx->simplify_ctx->labels,
                                       ctx->simplify_ctx->temp_insns,(VARR_MIR_insn_t *)pMVar55,
                                       pMVar58,pMVar56);
                            VARR_MIR_insn_tpush(ctx->simplify_ctx->cold_insns,pMVar58);
                            pVVar61 = extraout_RDX_00;
                          }
                          local_5e8 = (pMVar55->insn_link).next;
                        }
                        else {
                          local_5e8 = (MIR_insn_t)0x0;
                        }
                        while (pMVar56 = pDVar59->head, pMVar56 != local_5e8) {
                          if (*(int *)&pMVar56->field_0x18 == 0xac) {
                            __assert_fail("insn->code != MIR_JRET",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0x101a,"void process_inlines(MIR_context_t, MIR_item_t)")
                            ;
                          }
                          psVar1 = &ctx->simplify_ctx->inline_insns_after;
                          *psVar1 = *psVar1 + 1;
                          pMVar55 = MIR_copy_insn(ctx,pMVar56);
                          if (pMVar56 == pMVar54) {
                            local_5e0 = pMVar55;
                          }
                          change_inline_insn_regs(ctx,pMVar55);
                          if (*(int *)&pMVar55->field_0x18 == 0xab) {
                            if ((((pMVar56->insn_link).next != local_5e8) ||
                                (pMVar43->ops[0].field_0x8 != '\b')) ||
                               ((pMVar43->ops[0].u.ref)->item_type != MIR_proto_item)) {
                              __assert_fail("(DLIST_MIR_insn_t_next (insn)) == stop_insn && call->ops[0].mode == MIR_OP_REF && call->ops[0].u.ref->item_type == MIR_proto_item"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                            ,0x1027,
                                            "void process_inlines(MIR_context_t, MIR_item_t)");
                            }
                            uVar60 = *(uint *)&pMVar56->field_0x1c;
                            if (uVar60 != pMVar62->nres) {
                              __assert_fail("called_func->nres == actual_nops",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                            ,0x1028,
                                            "void process_inlines(MIR_context_t, MIR_item_t)");
                            }
                            piVar57 = piVar15;
                            for (lVar66 = 0; (ulong)uVar60 * 0x30 != lVar66; lVar66 = lVar66 + 0x30)
                            {
                              MVar73 = MIR_FMOV;
                              if ((&pMVar55->ops[0].field_0x8)[lVar66] != '\x01') {
                                __assert_fail("ret_insn->ops[i].mode == MIR_OP_REG",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                              ,0x102b,
                                              "void process_inlines(MIR_context_t, MIR_item_t)");
                              }
                              iVar36 = *piVar57;
                              if (iVar36 != 8) {
                                if (iVar36 == 9) {
                                  MVar73 = MIR_DMOV;
                                }
                                else {
                                  MVar73 = (uint)(iVar36 == 10) * 3;
                                }
                              }
                              in_stack_fffffffffffff950 =
                                   SUB324(*(undefined1 (*) [32])
                                           ((long)&pMVar43[1].ops[0].u + lVar66),8);
                              in_ZMM1 = ZEXT1664(SUB3216(*(undefined1 (*) [32])
                                                          ((long)&pMVar43[1].ops[0].u +
                                                          lVar66 + 0x10),0));
                              pMVar58 = MIR_new_insn(ctx,MVar73);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar58);
                              piVar57 = piVar57 + 1;
                            }
                            free(pMVar55);
                            pVVar61 = extraout_RDX_02;
                          }
                          else {
                            pMVar58 = pMVar55;
                            MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar55)
                            ;
                            store_labels_for_duplication
                                      ((MIR_context_t)ctx->simplify_ctx->labels,
                                       ctx->simplify_ctx->temp_insns,(VARR_MIR_insn_t *)pMVar56,
                                       pMVar55,pMVar58);
                            pVVar61 = extraout_RDX_01;
                          }
                          pDVar59 = (DLIST_MIR_insn_t *)&(pMVar56->insn_link).next;
                        }
                        redirect_duplicated_labels
                                  ((MIR_context_t)ctx->simplify_ctx->labels,
                                   ctx->simplify_ctx->temp_insns,pVVar61);
                        if (non_top_alloca_p != 0) {
                          MVar38 = new_temp_reg(ctx,MIR_T_I64,pMVar11);
                          pMVar56 = MIR_new_insn(ctx,MIR_BSTART);
                          MIR_insert_insn_after(ctx,(MIR_item_t_conflict)pMVar41,pMVar43,pMVar56);
                          auVar28._9_7_ = op_19._9_7_;
                          auVar28._0_9_ = (unkuint9)1 << 0x40;
                          in_stack_fffffffffffff950 = auVar28._8_4_;
                          in_ZMM1 = ZEXT1664(CONCAT124(op_19.u._4_12_,MVar38));
                          pMVar56 = MIR_new_insn(ctx,MIR_BEND);
                          MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,pMVar51,pMVar56);
                        }
                        pMVar51 = local_5b8;
                        pMVar56 = local_5b8;
                        if (pMVar54 != (MIR_insn_t_conflict)0x0) {
                          if (called_func_top_alloca_used_p != 0) {
                            func_top_alloca_used_p = 1;
                            if (local_5d8 == (MIR_insn_t_conflict)0x0) {
                              new_temp_reg(ctx,MIR_T_I64,pMVar11);
                              local_5d8 = MIR_new_insn(ctx,MIR_ALLOCA);
                              if (*(int *)&pMVar51->field_0x18 == 0xb4) {
                                MIR_insert_insn_after
                                          (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,local_5d8);
                              }
                              else {
                                MIR_insert_insn_before
                                          (ctx,(MIR_item_t_conflict)pMVar41,pMVar51,local_5d8);
                              }
                              pMVar51 = MIR_new_insn(ctx,MIR_MOV);
                              MIR_insert_insn_before
                                        (ctx,(MIR_item_t_conflict)pMVar41,local_5d8,pMVar51);
                              local_5b0 = (MIR_insn_t)0x0;
                            }
                            if (obj_00 == (MIR_insn_t)alloca_size) {
                              auVar6 = *(undefined1 (*) [32])local_5e0->ops;
                              MVar27 = local_5e0->ops[0].u.str;
                            }
                            else {
                              MVar38 = new_temp_reg(ctx,MIR_T_I64,pMVar11);
                              pMVar51 = MIR_new_insn(ctx,MIR_ADD);
                              MIR_insert_insn_after
                                        (ctx,(MIR_item_t_conflict)pMVar41,pMVar43,pMVar51);
                              auVar6._9_7_ = op_24._9_7_;
                              auVar6._0_9_ = (unkuint9)1 << 0x40;
                              auVar6._16_4_ = MVar38;
                              auVar6._20_12_ = op_24.u._4_12_;
                              MVar27._4_12_ = op_24.u._4_12_;
                              MVar27.len._0_4_ = MVar38;
                            }
                            pMVar56 = local_5b8;
                            in_stack_fffffffffffff950 = auVar6._8_4_;
                            in_ZMM1 = ZEXT1664((undefined1  [16])MVar27);
                            pMVar51 = MIR_new_insn(ctx,MIR_MOV);
                            MIR_insert_insn_after(ctx,(MIR_item_t_conflict)pMVar41,pMVar43,pMVar51);
                          }
                          if (pMVar56 == local_5e0) {
                            pMVar56 = (pMVar56->insn_link).next;
                          }
                          MIR_remove_insn(ctx,(MIR_item_t_conflict)pMVar41,local_5e0);
                        }
                        if (pMVar56 == pMVar43) {
                          pMVar56 = (pMVar56->insn_link).next;
                        }
                        MIR_remove_insn(ctx,(MIR_item_t_conflict)pMVar41,pMVar43);
                        if (pMVar56 == pMVar43) {
                          pMVar56 = list->head;
                        }
                        pDVar59 = (DLIST_MIR_insn_t *)&(pMVar14->insn_link).next;
                        if (pMVar14 == (MIR_insn_t)0x0) {
                          pDVar59 = list;
                        }
                        pMVar51 = pDVar59->head;
                        local_5b8 = pMVar56;
                        goto LAB_00114230;
                      }
                    }
                    simplify_op(ctx,(MIR_item_t_conflict)pMVar41,pMVar43,1,0,MVar73,0,
                                in_stack_fffffffffffff950);
                    goto LAB_00114230;
                  }
LAB_00114341:
                  simplify_op(ctx,(MIR_item_t_conflict)pMVar41,pMVar43,1,0,MVar73,0,
                              in_stack_fffffffffffff950);
                }
                goto LAB_00114230;
              }
              sVar47 = VARR_MIR_insn_tlength(psVar50->anchors);
              if (sVar47 != 0) {
LAB_00115b89:
                __assert_fail("(VARR_MIR_insn_tlength (ctx->simplify_ctx->anchors)) == 0 && (VARR_size_tlength (ctx->simplify_ctx->alloca_sizes)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x1064,"void process_inlines(MIR_context_t, MIR_item_t)");
              }
              pVVar13 = ctx->simplify_ctx->alloca_sizes;
              if (pVVar13 == (VARR_size_t *)0x0) {
                pcVar71 = "length";
                goto LAB_00115ae8;
              }
              if (pVVar13->els_num != 0) goto LAB_00115b89;
              if (local_5d8 != (MIR_insn_t_conflict)0x0) {
                if (func_top_alloca_used_p == 0) {
                  MIR_remove_insn(ctx,(MIR_item_t_conflict)pMVar41,local_5d8);
                }
                else if (local_5d0 != local_5b0) {
                  MVar38 = new_temp_reg(ctx,MIR_T_I64,pMVar11);
                  var.name._0_1_ = '\x01';
                  var.type = MIR_T_I8;
                  var._4_4_ = 0;
                  uStack_540 = 3;
                  align._0_4_ = 0;
                  align._4_4_ = 0;
                  MStack_538 = (MIR_reg_t)local_5d0;
                  uStack_534 = (undefined4)((ulong)local_5d0 >> 0x20);
                  auVar20[9] = var.name._1_1_;
                  auVar20._0_9_ = (unkuint9)1 << 0x40;
                  auVar20._10_6_ = var.name._2_6_;
                  in_stack_fffffffffffff950 = auVar20._8_4_;
                  in_ZMM1 = ZEXT1664(CONCAT88(uStack_580,CONCAT44(var.size._4_4_,MVar38)));
                  var.size._0_4_ = MVar38;
                  pMVar51 = MIR_new_insn(ctx,MIR_MOV);
                  local_5d8[1].data = (void *)0x0;
                  *(undefined2 *)&local_5d8[1].insn_link.prev = 1;
                  *(MIR_reg_t *)&local_5d8[1].insn_link.next = MVar38;
                  MIR_insert_insn_before(ctx,(MIR_item_t_conflict)pMVar41,local_5d8,pMVar51);
                }
              }
              while( true ) {
                pMVar69 = (MIR_context_t)ctx->simplify_ctx->cold_insns;
                sVar47 = VARR_MIR_insn_tlength((VARR_MIR_insn_t *)pMVar69);
                if (sVar47 == 0) break;
                pMVar51 = VARR_MIR_insn_tpop(ctx->simplify_ctx->cold_insns);
                if (*(int *)&pMVar51->field_0x18 == 0xb4) {
                  pMVar42 = (MIR_item_t)ctx->simplify_ctx->new_label_num;
                  ctx->simplify_ctx->new_label_num = (size_t)((long)&pMVar42->data + 1);
                  pMVar51->ops[0].u.ref = pMVar42;
                }
                MIR_append_insn(ctx,(MIR_item_t_conflict)pMVar41,pMVar51);
              }
              uVar53 = ctx->simplify_ctx->new_label_num;
              if (ctx->curr_label_num < uVar53) {
                ctx->curr_label_num = uVar53;
              }
              pMVar41->data = (void *)0x0;
              MVar39 = *(MIR_item_type_t *)&pMVar41->ops[0].data;
            }
            Var32 = v.ld;
            pMVar70 = pMVar69;
            if (MVar39 == MIR_expr_data_item) {
              pMVar17 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar41->ops[0].u + 0x10))->
                        expr_data;
              MVar67 = *((pMVar17->expr_item->u).func)->res_types;
              uVar33 = v._8_2_;
              switch(MVar67) {
              case MIR_T_I8:
              case MIR_T_U8:
                v.i8 = local_508;
                break;
              case MIR_T_I16:
              case MIR_T_U16:
                v.field8[1] = uStack_507;
                v.i8 = local_508;
                v._2_8_ = SUB108(Var32,2);
                break;
              case MIR_T_I32:
              case MIR_T_U32:
                v.field8[1] = uStack_507;
                v.i8 = local_508;
                v.i32._2_2_ = uStack_506;
                break;
              case MIR_T_I64:
              case MIR_T_U64:
              case MIR_T_P:
                v.field8[1] = uStack_507;
                v.i8 = local_508;
                v.i32._2_2_ = uStack_506;
                v.i64._4_4_ = uStack_504;
                v.ld = (longdouble)CONCAT28(uVar33,v._0_8_);
                break;
              case MIR_T_F:
                v._1_1_ = uStack_507;
                v._0_1_ = local_508;
                v._2_2_ = uStack_506;
                break;
              case MIR_T_D:
                v.field8[1] = uStack_507;
                v._0_1_ = local_508;
                v._2_2_ = uStack_506;
                v.i64._4_4_ = uStack_504;
                v.ld = (longdouble)CONCAT28(uVar33,v._0_8_);
                break;
              case MIR_T_LD:
                v.ld = (longdouble)
                       CONCAT28(uStack_500,
                                CONCAT44(uStack_504,
                                         CONCAT22(uStack_506,CONCAT11(uStack_507,local_508))));
                break;
              default:
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x7ef,
                              "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                             );
              }
              pMVar70 = (MIR_context_t)pMVar17->load_addr;
              sVar47 = _MIR_type_size(pMVar69,MVar67);
              memcpy(pMVar70,&v,sVar47);
            }
          }
LAB_00115a33:
          pMVar69 = pMVar70;
          pDVar72 = (DLIST_MIR_item_t *)&pMVar41->field_0x18;
        }
        uVar74 = uVar74 + 1;
      } while( true );
    }
    pMVar40 = ix;
    pMVar41 = (MIR_insn_t)VARR_MIR_module_tget(ctx->modules_to_link,(size_t)ix);
    ctx->simplify_ctx->new_label_num = 0;
    VARR_uint8_ttrunc(ctx->used_label_p,(size_t)pMVar40);
    pDVar72 = (DLIST_MIR_item_t *)&(pMVar41->insn_link).next;
    local_5b0 = pMVar41;
LAB_001130b5:
    func_item = (MIR_label_t)pDVar72->head;
    if (func_item != (MIR_label_t)0x0) {
      switch(*(MIR_item_type_t *)&func_item->ops[0].data) {
      case MIR_func_item:
        if (func_item->data != (void *)0x0) {
          __assert_fail("item->data == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x7b1,
                        "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                       );
        }
        vn_empty(ctx);
        pMVar62 = ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->func;
        for (uVar74 = 0; uVar74 < pMVar62->nargs; uVar74 = uVar74 + 1) {
          pMVar40 = (MIR_label_t)pMVar62->vars;
          VARR_MIR_var_tget(&var,(VARR_MIR_var_t *)pMVar40,uVar74);
          if ((ulong)var.type < 6) {
            MVar73 = *(MIR_insn_code_t *)(&DAT_00179a68 + (ulong)var.type * 4);
            op.u.reg = MIR_reg(ctx,(char *)CONCAT62(var.name._2_6_,
                                                    CONCAT11(var.name._1_1_,(char)var.name)),pMVar62
                              );
            op._8_1_ = 1;
            op.data = (void *)0x0;
            auVar25[9] = op._9_1_;
            auVar25._0_9_ = (unkuint9)1 << 0x40;
            auVar25._10_6_ = op._10_6_;
            in_stack_fffffffffffff950 = auVar25._8_4_;
            in_ZMM1 = ZEXT1664(CONCAT88(op.u.str.s,CONCAT44(op.u.mem.alias,op.u.reg)));
            pMVar51 = MIR_new_insn(ctx,MVar73);
            pMVar40 = func_item;
            MIR_prepend_insn(ctx,(MIR_item_t_conflict)func_item,pMVar51);
          }
        }
        VARR_MIR_insn_ttrunc(ctx->simplify_ctx->temp_insns,(size_t)pMVar40);
        pMVar69 = (MIR_context_t)ctx->simplify_ctx->labels;
        VARR_MIR_insn_ttrunc((VARR_MIR_insn_t *)pMVar69,(size_t)pMVar40);
        iVar36 = 0;
        bVar31 = false;
        pMVar51 = (pMVar62->insns).head;
        uVar60 = extraout_EAX;
LAB_001132e3:
        do {
          MVar77 = in_ZMM1._0_16_;
          if (pMVar51 == (MIR_insn_t_conflict)0x0) goto LAB_00113b36;
          uVar8 = *(undefined8 *)&pMVar51->field_0x18;
          MVar73 = (MIR_insn_code_t)uVar8;
          if (((MVar73 < MIR_EXT8) && (pMVar51->ops[0].field_0x8 == '\n')) &&
             (*(char *)&pMVar51[1].insn_link.prev == '\n')) {
            MVar67 = MIR_T_I64;
            if (MVar73 != MIR_MOV) {
              if (MVar73 == MIR_FMOV) {
                MVar67 = MIR_T_F;
              }
              else {
                MVar67 = (MVar73 != MIR_DMOV) + MIR_T_D;
              }
            }
            var.size._0_4_ = new_temp_reg(ctx,MVar67,pMVar62);
            var.type = MIR_T_I8;
            var._4_4_ = 0;
            uVar60 = (uVar60 & 0xffffff00) + 1;
            var.name._0_1_ = (char)uVar60;
            var.name._1_1_ = (undefined1)(uVar60 >> 8);
            in_stack_fffffffffffff950 = (int)*(undefined8 *)&pMVar51->ops[0].field_0x8;
            pMVar43 = MIR_new_insn(ctx,MVar73);
            pMVar40 = func_item;
            pMVar69 = ctx;
            MIR_insert_insn_after(ctx,(MIR_item_t_conflict)func_item,pMVar51,pMVar43);
            auVar22._4_4_ = var._4_4_;
            auVar22._0_4_ = var.type;
            auVar22[8] = (char)var.name;
            auVar22[9] = var.name._1_1_;
            auVar22._10_6_ = var.name._2_6_;
            auVar22._16_4_ = (MIR_reg_t)var.size;
            auVar22._20_4_ = var.size._4_4_;
            auVar22._24_8_ = uStack_580;
            MVar77.len._4_4_ = var.size._4_4_;
            MVar77.len._0_4_ = (MIR_reg_t)var.size;
            MVar77.s = (char *)uStack_580;
            aVar23._16_8_ = uStack_578;
            aVar23.str = MVar77;
            aVar23.mem.disp = uStack_570;
            pMVar51->ops[0].u = aVar23;
            *(undefined1 (*) [32])pMVar51->ops = auVar22;
          }
          lVar66 = 8;
          if (MVar73 != MIR_RET) {
            if (MVar73 == MIR_LABEL) {
              lVar66 = 0x18;
              goto LAB_001133ff;
            }
            pMVar45 = (pMVar51->insn_link).next;
            if (MVar73 != MIR_ALLOCA) goto LAB_00113419;
            if ((ushort)(*(byte *)&pMVar51[1].insn_link.prev - 3) < 2) {
              pMVar69 = (MIR_context_t)pMVar51[1].insn_link.next;
              pMVar40 = (MIR_label_t)&max_align;
              auVar78 = ZEXT1664((undefined1  [16])MVar77);
              pMVar41 = (MIR_insn_t)get_alloca_size_align((int64_t)pMVar69,(int64_t *)pMVar40);
              while (((MVar77 = auVar78._0_16_, pMVar45 != (MIR_insn_t_conflict)0x0 &&
                      (*(int *)&pMVar45->field_0x18 == 0xad)) &&
                     ((ushort)(*(byte *)&pMVar45[1].insn_link.prev - 3) < 2))) {
                pMVar64 = pMVar45->ops;
                op2.data = pMVar64->data;
                op2._8_8_ = *(undefined8 *)&pMVar64->field_0x8;
                op2.u = pMVar64->u;
                aVar5 = pMVar51->ops[0].u;
                in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar51->ops,8);
                MVar77 = aVar5.str;
                op1.u._16_8_ = aVar5._16_8_;
                op1._0_32_ = *(undefined1 (*) [32])pMVar51->ops;
                op1.u.mem.disp = aVar5.mem.disp;
                iVar35 = MIR_op_eq_p(pMVar69,op1,op2);
                if (iVar35 != 0) break;
                iVar44 = get_alloca_size_align((int64_t)pMVar45[1].insn_link.next,&align);
                lVar66 = CONCAT44(align._4_4_,(int)align);
                if (max_align < lVar66) {
                  lVar2 = (long)pMVar41->ops + lVar66 + -0x21;
                  pMVar41 = (MIR_insn_t)(lVar2 - lVar2 % lVar66);
                  max_align = lVar66;
                }
                op_2._8_1_ = 3;
                op_2.data = (void *)0x0;
                in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar64,8);
                auVar78 = ZEXT1664((undefined1  [16])pMVar45->ops[0].u.str);
                op_2.u.ref = (MIR_item_t)pMVar41;
                pMVar43 = MIR_new_insn(ctx,MIR_ADD);
                pMVar41 = (MIR_insn_t)((long)pMVar41->ops + iVar44 + -0x20);
                MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar45,pMVar43);
                pMVar40 = func_item;
                pMVar69 = ctx;
                MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar45);
                pMVar45 = (pMVar43->insn_link).next;
              }
              pMVar51[1].insn_link.next = pMVar41;
              goto LAB_00113415;
            }
LAB_001137d8:
            bVar76 = pMVar45 != (MIR_label_t)0x0;
            goto LAB_001137de;
          }
LAB_001133ff:
          pMVar69 = *(MIR_context_t *)((long)&ctx->simplify_ctx->val_tab + lVar66);
          pMVar40 = pMVar51;
          VARR_MIR_insn_tpush((VARR_MIR_insn_t *)pMVar69,pMVar51);
LAB_00113415:
          pMVar45 = (pMVar51->insn_link).next;
LAB_00113419:
          if (0xfffffffc < MVar73 - MIR_SWITCH) {
            bVar31 = true;
          }
          uVar34 = MVar73 - MIR_MULO;
          if (0x32 < uVar34) {
LAB_00113664:
            uVar34 = MVar73 - MIR_ADD;
            if (uVar34 < 0x26) {
              if ((0x3ff0000063U >> ((ulong)uVar34 & 0x3f) & 1) == 0) {
                if ((0x18c00UL >> ((ulong)uVar34 & 0x3f) & 1) != 0) goto LAB_001136ae;
              }
              else {
LAB_00113681:
                if ((*(char *)((long)&pMVar51[1].ops[0].u + 8) == '\x03') &&
                   (*(long *)((long)&pMVar51[1].ops[0].u + 0x10) == 0)) goto LAB_001136c6;
              }
            }
            goto LAB_0011374a;
          }
          if ((0x78f1e3c78c7f0U >> ((ulong)uVar34 & 0x3f) & 1) == 0) {
            if ((3UL >> ((ulong)uVar34 & 0x3f) & 1) == 0) goto LAB_00113664;
LAB_001136ae:
            if ((*(char *)((long)&pMVar51[1].ops[0].u + 8) != '\x03') ||
               (*(long *)((long)&pMVar51[1].ops[0].u + 0x10) != 1)) {
              if (MVar73 - MIR_OR < 10) goto LAB_00113681;
              goto LAB_0011374a;
            }
LAB_001136c6:
            pMVar64 = pMVar51->ops;
            op1_00.data = pMVar64->data;
            op1_00._8_8_ = *(undefined8 *)&pMVar64->field_0x8;
            op1_00.u = pMVar64->u;
            in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar64,8);
            iVar36 = MIR_op_eq_p(pMVar69,op1_00,*(MIR_op_t *)(pMVar51 + 1));
            if (iVar36 != 0) goto LAB_00113855;
            MVar73 = MIR_MOV;
            MVar77 = pMVar51->ops[0].u.str;
            in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar51->ops,8);
LAB_00113837:
            pMVar45 = MIR_new_insn(ctx,MVar73);
            MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar51,pMVar45);
          }
          else if (pMVar51->ops[0].field_0x8 == '\f') {
            pMVar46 = pMVar51->ops[0].u.label;
            pMVar40 = pMVar46;
            pMVar43 = skip_labels(pMVar45,pMVar46);
            if (pMVar43 != pMVar46) goto LAB_0011374a;
          }
          else {
LAB_0011374a:
            if ((0x2d < MVar73 - MIR_BT) ||
               ((0x3c78f1e3c63fU >> ((ulong)(MVar73 - MIR_BT) & 0x3f) & 1) == 0)) goto LAB_001137d8;
            if (pMVar45 == (MIR_label_t)0x0) {
              bVar76 = false;
              pMVar45 = (MIR_insn_t_conflict)0x0;
            }
            else {
              bVar76 = true;
              if (((*(int *)&pMVar45->field_0x18 == 0x76) && (pMVar51->ops[0].field_0x8 == '\f')) &&
                 (pMVar45->ops[0].field_0x8 == '\f')) {
                pMVar46 = pMVar45->ops[0].u.label;
                stop = pMVar51->ops[0].u.label;
                in_ZMM1 = ZEXT1664((undefined1  [16])MVar77);
                pMVar43 = skip_labels(pMVar46,stop);
                if (pMVar43 != stop) {
                  pMVar40 = pMVar46;
                  pMVar43 = skip_labels(stop,pMVar46);
                  MVar77 = in_ZMM1._0_16_;
                  if (pMVar43 != pMVar46) goto LAB_001137de;
                }
                pMVar40 = func_item;
                pMVar69 = ctx;
                MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar51);
                iVar36 = 0;
                pMVar51 = pMVar45;
                goto LAB_001132e3;
              }
            }
LAB_001137de:
            if (((3 < MVar73 - MIR_BT) || (*(char *)&pMVar51[1].insn_link.prev != '\x03')) ||
               (pMVar41 = pMVar51[1].insn_link.next, (MIR_insn_t)0x1 < pMVar41)) {
              uVar74 = *(ulong *)&pMVar51->field_0x18;
              pMVar69 = (MIR_context_t)(uVar74 & 0xffffffff);
              in_ZMM1 = ZEXT1664((undefined1  [16])MVar77);
              MVar37 = MIR_reverse_branch_code((MIR_insn_code_t)uVar74);
              if ((((bool)(MVar37 != MIR_INSN_BOUND & bVar76)) &&
                  (*(int *)&pMVar45->field_0x18 == 0x76)) &&
                 ((pMVar69 = (MIR_context_t)(pMVar45->insn_link).next, pMVar69 != (MIR_context_t)0x0
                  && ((pMVar69->func_redef_permission_p == 0xb4 &&
                      (pMVar51->ops[0].field_0x8 == '\f')))))) {
                pMVar46 = pMVar51->ops[0].u.label;
                pMVar40 = pMVar46;
                pMVar43 = skip_labels((MIR_label_t)pMVar69,pMVar46);
                if (pMVar43 == pMVar46) {
                  auVar6 = *(undefined1 (*) [32])pMVar45->ops;
                  aVar5 = pMVar45->ops[0].u;
                  pMVar51->ops[0].u = aVar5;
                  *(undefined1 (*) [32])pMVar51->ops = auVar6;
                  *(ulong *)&pMVar51->field_0x18 = uVar74 & 0xffffffff00000000 | (ulong)MVar37;
                  in_ZMM1 = ZEXT1664((undefined1  [16])aVar5.str);
                  pMVar40 = func_item;
                  pMVar69 = ctx;
                  MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar45);
                  iVar36 = 0;
                  goto LAB_001132e3;
                }
              }
              uVar34 = MVar73 - MIR_JMP;
              if ((((uVar34 < 0x2f) && (uVar34 != 0x2a)) || (MVar73 == MIR_LDBGE)) &&
                 (pMVar51->ops[0].field_0x8 == '\f')) {
                pMVar69 = (MIR_context_t)pMVar51->ops[0].u.label;
                pMVar40 = (MIR_label_t)0x0;
                pMVar43 = skip_labels((MIR_label_t)pMVar69,(MIR_label_t)0x0);
                if ((pMVar43 != (MIR_insn_t_conflict)0x0) &&
                   (iVar36 < 0x1f && *(int *)&pMVar43->field_0x18 == 0x76)) {
                  auVar6 = *(undefined1 (*) [32])pMVar43->ops;
                  aVar5 = pMVar43->ops[0].u;
                  in_ZMM1 = ZEXT3264((undefined1  [32])aVar5);
                  iVar36 = iVar36 + 1;
                  pMVar51->ops[0].u = aVar5;
                  *(undefined1 (*) [32])pMVar51->ops = auVar6;
                  goto LAB_001132e3;
                }
              }
              if (MVar73 == MIR_SWITCH || uVar34 < 0x2f) {
                uVar53 = 1;
                uVar75 = 2;
                if ((char)uVar8 != -0x5b) {
                  if ((MVar73 & (MIR_BNE|MIR_LDBEQ)) != MIR_SWITCH) goto LAB_001139d1;
                  uVar75 = uVar74 >> 0x20;
                }
LAB_001139ee:
                for (; uVar53 < uVar75; uVar53 = uVar53 + 1) {
                  pMVar46 = pMVar51->ops[uVar53].u.label;
                  if (*(int *)&pMVar46->field_0x18 != 0xb4) {
                    __assert_fail("label->code == MIR_LABEL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                  ,0xe36,"MIR_insn_t last_label(MIR_label_t)");
                  }
                  pMVar41 = pMVar46;
                  do {
                    pMVar40 = pMVar41;
                    pMVar41 = (pMVar40->insn_link).next;
                    if (pMVar41 == (MIR_insn_t)0x0) break;
                  } while (*(int *)&pMVar41->field_0x18 == 0xb4);
                  if (pMVar40 != pMVar46) {
                    pMVar51->ops[uVar53].u.label = pMVar40;
                  }
                  pMVar69 = ctx;
                  mark_used_label(ctx,pMVar40);
                }
                uVar74 = *(ulong *)&pMVar51->field_0x18;
              }
              else {
                if (MVar73 - MIR_PRBEQ < 2) {
LAB_001139d1:
                  uVar53 = 0;
                  uVar75 = 1;
                  goto LAB_001139ee;
                }
                uVar53 = 1;
                uVar75 = 2;
                if (MVar73 == MIR_LADDR) goto LAB_001139ee;
              }
              for (sVar47 = 0; uVar74 >> 0x20 != sVar47; sVar47 = sVar47 + 1) {
                MIR_insn_op_mode(ctx,pMVar51,sVar47,(int *)&align);
                pMVar40 = func_item;
                pMVar69 = ctx;
                simplify_op(ctx,(MIR_item_t_conflict)func_item,pMVar51,(int)sVar47,(int)align,
                            (MIR_insn_code_t)uVar74,
                            (uint)(sVar47 == 1 && *(int *)&pMVar51->field_0x18 - 0xa7U < 3),
                            in_stack_fffffffffffff950);
              }
              iVar36 = 0;
              pMVar51 = pMVar45;
              goto LAB_001132e3;
            }
            if (MVar73 - MIR_BT < 2 != (pMVar41 != (MIR_insn_t)0x1)) {
              MVar77 = pMVar51->ops[0].u.str;
              in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar51->ops,8);
              MVar73 = MIR_JMP;
              goto LAB_00113837;
            }
          }
LAB_00113855:
          in_ZMM1 = ZEXT1664((undefined1  [16])MVar77);
          pMVar40 = func_item;
          pMVar69 = ctx;
          MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar51);
          iVar36 = 0;
          pMVar51 = pMVar45;
        } while( true );
      default:
        goto switchD_001130d7_caseD_1;
      case MIR_import_item:
        pMVar40 = (MIR_label_t)
                  ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->import_id
        ;
        pMVar42 = item_tab_find(ctx,(char *)pMVar40,&ctx->environment_module);
        if (pMVar42 == (MIR_item_t_conflict)0x0) {
          if ((import_resolver == (_func_void_ptr_char_ptr *)0x0) ||
             (addr = (*import_resolver)(((anon_union_8_10_166bea1d_for_u *)
                                        ((long)&func_item->ops[0].u + 0x10))->import_id),
             addr == (void *)0x0)) {
            pMVar62 = ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->func;
            pcVar71 = "import of undefined item %s";
            goto LAB_00115c55;
          }
          MIR_load_external(ctx,((anon_union_8_10_166bea1d_for_u *)
                                ((long)&func_item->ops[0].u + 0x10))->import_id,addr);
          pMVar40 = (MIR_label_t)
                    ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->
                    import_id;
          pMVar42 = item_tab_find(ctx,(char *)pMVar40,&ctx->environment_module);
          if (pMVar42 == (MIR_item_t_conflict)0x0) goto LAB_00115c5d;
        }
        break;
      case MIR_export_item:
        pMVar40 = (MIR_label_t)
                  ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->import_id
        ;
        pMVar42 = item_tab_find(ctx,(char *)pMVar40,(MIR_module_t_conflict)local_5b0);
        if (pMVar42 == (MIR_item_t_conflict)0x0) {
          pMVar62 = ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->func;
          pcVar71 = "export of undefined item %s";
LAB_00115c55:
          (*ctx->error_func)(MIR_undeclared_op_ref_error,pcVar71,pMVar62);
LAB_00115c5d:
          __assert_fail("tab_item != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x7ba,
                        "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                       );
        }
        break;
      case MIR_forward_item:
        pMVar40 = (MIR_label_t)
                  ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->import_id
        ;
        pMVar42 = item_tab_find(ctx,(char *)pMVar40,(MIR_module_t_conflict)local_5b0);
        if (pMVar42 == (MIR_item_t_conflict)0x0) {
          pMVar62 = ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->func;
          pcVar71 = "forward of undefined item %s";
          goto LAB_00115c55;
        }
      }
      func_item->ops[0].u.i = (int64_t)pMVar42->addr;
      *(MIR_item_t *)&func_item->ops[0].field_0x8 = pMVar42;
      goto switchD_001130d7_caseD_1;
    }
    ix = (MIR_label_t)((long)&ix->data + 1);
  } while( true );
LAB_00113b36:
  pMVar11 = ((anon_union_8_10_166bea1d_for_u *)((long)&func_item->ops[0].u + 0x10))->func;
  varr = ctx->temp_ops;
  pMVar49 = pMVar11->res_types;
  pVVar61 = ctx->simplify_ctx->temp_insns;
  in_ZMM1 = ZEXT1664((undefined1  [16])MVar77);
  sVar47 = VARR_MIR_insn_tlength(pVVar61);
  if (sVar47 != 0) {
    pMVar51 = VARR_MIR_insn_tlast(pVVar61);
    VARR_MIR_op_ttrunc(varr,(size_t)pMVar40);
    sVar47 = VARR_MIR_insn_tlength(pVVar61);
    if (sVar47 < 2) {
      local_5f0 = (MIR_insn_t_conflict)0x0;
    }
    else {
      local_5f0 = MIR_new_label(ctx);
      pMVar40 = func_item;
      MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar51,local_5f0);
    }
    pMVar64 = pMVar51->ops;
    pMVar45 = func_item;
    for (uVar74 = 0; uVar74 < pMVar11->nres; uVar74 = uVar74 + 1) {
      uVar8 = *(undefined8 *)&pMVar64->field_0x8;
      pcStack_530 = (pMVar64->u).str.s;
      uStack_528 = *(undefined8 *)((long)&pMVar64->u + 0x10);
      MStack_520 = (pMVar64->u).mem.disp;
      align._0_4_ = (int)pMVar64->data;
      align._4_4_ = (undefined4)((ulong)pMVar64->data >> 0x20);
      uStack_540 = (undefined1)uVar8;
      uStack_53f = (undefined1)((ulong)uVar8 >> 8);
      uStack_53e = (undefined6)((ulong)uVar8 >> 0x10);
      MStack_538 = (MIR_reg_t)(pMVar64->u).i;
      uStack_534 = (undefined4)((ulong)(pMVar64->u).i >> 0x20);
      aVar5 = pMVar64->u;
      in_stack_fffffffffffff950 = SUB324(*(undefined1 (*) [32])pMVar64,8);
      in_ZMM1 = ZEXT1664((undefined1  [16])aVar5.str);
      obj.u._16_8_ = aVar5._16_8_;
      obj._0_32_ = *(undefined1 (*) [32])pMVar64;
      obj.u.mem.disp = aVar5.mem.disp;
      VARR_MIR_op_tpush(varr,obj);
      uVar53 = (ulong)pMVar49[uVar74];
      if (uVar53 < 6) {
        MVar73 = *(MIR_insn_code_t *)(&DAT_00179a68 + uVar53 * 4);
        MStack_538 = new_temp_reg(ctx,MIR_T_I64,pMVar11);
        align._0_4_ = 0;
        align._4_4_ = 0;
        uVar60 = ((uint)pMVar45 & 0xffffff00) + 1;
        pMVar45 = (MIR_label_t)(ulong)uVar60;
        uStack_540 = (undefined1)uVar60;
        uStack_53f = (undefined1)(uVar60 >> 8);
        in_stack_fffffffffffff950 = (int)CONCAT62(uStack_53e,(short)uVar60);
        pMVar43 = MIR_new_insn(ctx,MVar73);
        pMVar40 = func_item;
        MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar51,pMVar43);
        auVar24._4_4_ = align._4_4_;
        auVar24._0_4_ = (int)align;
        auVar24[8] = uStack_540;
        auVar24[9] = uStack_53f;
        auVar24._10_6_ = uStack_53e;
        auVar24._16_4_ = MStack_538;
        auVar24._20_4_ = uStack_534;
        auVar24._24_8_ = pcStack_530;
        aVar5.mem.alias = uStack_534;
        aVar5.reg = MStack_538;
        aVar5.str.s = pcStack_530;
        aVar5._16_8_ = uStack_528;
        aVar5.mem.disp = MStack_520;
        in_ZMM1 = ZEXT3264((undefined1  [32])aVar5);
        pMVar64->u = aVar5;
        *(undefined1 (*) [32])pMVar64 = auVar24;
      }
      pMVar64 = pMVar64 + 1;
    }
    pMVar45 = (MIR_label_t)0x0;
    while( true ) {
      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
      pMVar46 = (MIR_label_t)VARR_MIR_insn_tlength(pVVar61);
      if (pMVar46 <= pMVar45) break;
      pMVar40 = pMVar45;
      pMVar43 = VARR_MIR_insn_tget(pVVar61,(size_t)pMVar45);
      if (pMVar43 != pMVar51) {
        if (((int)*(undefined8 *)&pMVar43->field_0x18 != 0xab) &&
           ((uint32_t)((ulong)*(undefined8 *)&pMVar43->field_0x18 >> 0x20) != pMVar11->nres)) {
          __assert_fail("insn->code == MIR_RET || func->nres == MIR_insn_nops (ctx, insn)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0xde6,"void make_one_ret(MIR_context_t, MIR_item_t)");
        }
        lVar66 = 0x20;
        for (uVar74 = 0; uVar74 < pMVar11->nres; uVar74 = uVar74 + 1) {
          MVar67 = pMVar49[uVar74];
          MVar73 = MIR_FMOV;
          if (MVar67 != MIR_T_F) {
            if (MVar67 == MIR_T_D) {
              MVar73 = MIR_DMOV;
            }
            else {
              MVar73 = (uint)(MVar67 == MIR_T_LD) * 3;
            }
          }
          puVar3 = (undefined8 *)((long)pMVar43->ops + lVar66 + -0x20);
          uVar8 = *puVar3;
          uVar21 = puVar3[1];
          puVar3 = (undefined8 *)((long)pMVar43->ops + lVar66 + -0x10);
          uStack_580 = puVar3[1];
          uStack_578 = puVar3[2];
          uStack_570 = puVar3[3];
          var.type = (MIR_type_t)uVar8;
          var._4_4_ = SUB84((ulong)uVar8 >> 0x20,0);
          var.name._0_1_ = (char)uVar21;
          var.name._1_1_ = (undefined1)((ulong)uVar21 >> 8);
          var.name._2_6_ = (undefined6)((ulong)uVar21 >> 0x10);
          var.size._0_4_ = (MIR_reg_t)*puVar3;
          var.size._4_4_ = (undefined4)((ulong)*puVar3 >> 0x20);
          if ((char)var.name != '\x01') {
            __assert_fail("reg_op.mode == MIR_OP_REG",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0xdea,"void make_one_ret(MIR_context_t, MIR_item_t)");
          }
          if (((varr == (VARR_MIR_op_t *)0x0) || (pMVar64 = varr->varr, pMVar64 == (MIR_op_t *)0x0))
             || (varr->els_num <= uVar74)) {
            mir_varr_assert_fail("get","MIR_op_t");
          }
          uStack_528 = *(undefined8 *)((long)&pMVar64->data + lVar66);
          puVar3 = (undefined8 *)((long)pMVar64 + lVar66 + -0x20);
          uVar8 = puVar3[1];
          pcStack_530 = (char *)puVar3[3];
          MStack_520 = *(MIR_disp_t *)(&pMVar64->field_0x8 + lVar66);
          align._0_4_ = (int)*puVar3;
          align._4_4_ = (undefined4)((ulong)*puVar3 >> 0x20);
          uStack_540 = (undefined1)uVar8;
          uStack_53f = (undefined1)((ulong)uVar8 >> 8);
          uStack_53e = (undefined6)((ulong)uVar8 >> 0x10);
          MStack_538 = (MIR_reg_t)puVar3[2];
          uStack_534 = (undefined4)((ulong)puVar3[2] >> 0x20);
          pMVar56 = MIR_new_insn(ctx,MVar73);
          MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar43,pMVar56);
          lVar66 = lVar66 + 0x30;
        }
        uStack_490 = 0xc;
        max_align = 0;
        MStack_488 = (MIR_reg_t)local_5f0;
        uStack_484 = (undefined4)((ulong)local_5f0 >> 0x20);
        auVar26[9] = uStack_48f;
        auVar26._0_9_ = (unkuint9)0xc << 0x40;
        auVar26._10_6_ = uStack_48e;
        in_stack_fffffffffffff950 = auVar26._8_4_;
        in_ZMM1 = ZEXT1664(CONCAT88(pvStack_480,local_5f0));
        pMVar56 = MIR_new_insn(ctx,MIR_JMP);
        MIR_insert_insn_before(ctx,(MIR_item_t_conflict)func_item,pMVar43,pMVar56);
        pMVar40 = func_item;
        MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar43);
      }
      pMVar45 = (MIR_label_t)((long)&pMVar45->data + 1);
    }
  }
  ppMVar65 = &pMVar62->first_lref;
  while (pMVar9 = *ppMVar65, pMVar9 != (MIR_lref_data *)0x0) {
    mark_used_label(ctx,pMVar9->label);
    pMVar40 = pMVar9->label2;
    if (pMVar40 != (MIR_label_t)0x0) {
      mark_used_label(ctx,pMVar40);
    }
    ppMVar65 = &pMVar9->next;
  }
  pMVar45 = (MIR_label_t)0x0;
  while( true ) {
    pMVar46 = (MIR_label_t)VARR_MIR_insn_tlength(ctx->simplify_ctx->labels);
    pVVar61 = ctx->simplify_ctx->labels;
    if (pMVar46 <= pMVar45) break;
    pMVar40 = pMVar45;
    pMVar51 = VARR_MIR_insn_tget(pVVar61,(size_t)pMVar45);
    pMVar42 = pMVar51->ops[0].u.ref;
    sVar47 = VARR_uint8_tlength(ctx->used_label_p);
    if ((long)pMVar42 < (long)sVar47) {
      pVVar10 = ctx->used_label_p;
      if (((pVVar10 == (VARR_uint8_t *)0x0) || (pVVar10->varr == (uint8_t *)0x0)) ||
         ((MIR_item_t)pVVar10->els_num <= pMVar42)) {
        mir_varr_assert_fail("get","uint8_t");
      }
      if (pVVar10->varr[(long)pMVar42] == '\0') goto LAB_00113ff0;
      pMVar42 = (MIR_item_t)ctx->simplify_ctx->new_label_num;
      ctx->simplify_ctx->new_label_num = (size_t)((long)&pMVar42->data + 1);
      pMVar51->ops[0].data = (void *)0x0;
      *(undefined2 *)&pMVar51->ops[0].field_0x8 = 3;
      pMVar51->ops[0].u.ref = pMVar42;
    }
    else {
LAB_00113ff0:
      pMVar40 = func_item;
      MIR_remove_insn(ctx,(MIR_item_t_conflict)func_item,pMVar51);
    }
    pMVar45 = (MIR_label_t)((long)&pMVar45->data + 1);
  }
  VARR_MIR_insn_ttrunc(pVVar61,(size_t)pMVar40);
  if (bVar31) {
    func_item->data = (void *)0x1;
  }
switchD_001130d7_caseD_1:
  pDVar72 = (DLIST_MIR_item_t *)&func_item->field_0x18;
  goto LAB_001130b5;
}

Assistant:

void MIR_link (MIR_context_t ctx, void (*set_interface) (MIR_context_t ctx, MIR_item_t item),
               void *import_resolver (const char *)) {
  MIR_item_t item, tab_item, expr_item;
  MIR_type_t type;
  MIR_val_t res;
  MIR_module_t m;
  void *addr;
  union {
    int8_t i8;
    int16_t i16;
    int32_t i32;
    int64_t i64;
    float f;
    double d;
    long double ld;
    void *a;
  } v;

  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    simplify_module_init (ctx);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item))
      if (item->item_type == MIR_func_item) {
        assert (item->data == NULL);
        if (simplify_func (ctx, item, TRUE)) item->data = (void *) 1; /* flag inlining */
      } else if (item->item_type == MIR_import_item) {
        if ((tab_item = item_tab_find (ctx, item->u.import_id, &environment_module)) == NULL) {
          if (import_resolver == NULL || (addr = import_resolver (item->u.import_id)) == NULL)
            MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "import of undefined item %s",
                                      item->u.import_id);
          MIR_load_external (ctx, item->u.import_id, addr);
          tab_item = item_tab_find (ctx, item->u.import_id, &environment_module);
          mir_assert (tab_item != NULL);
        }
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_export_item) {
        if ((tab_item = item_tab_find (ctx, item->u.export_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "export of undefined item %s",
                                    item->u.export_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_forward_item) {
        if ((tab_item = item_tab_find (ctx, item->u.forward_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "forward of undefined item %s",
                                    item->u.forward_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item)) {
      if (item->item_type == MIR_func_item && item->data != NULL) {
        process_inlines (ctx, item);
        item->data = NULL;
#if 0
        fprintf (stderr, "+++++ Function after inlining:\n");
        MIR_output_item (ctx, stderr, item);
#endif
      } else if (item->item_type == MIR_ref_data_item) {
        assert (item->u.ref_data->ref_item->addr != NULL);
        addr = (char *) item->u.ref_data->ref_item->addr + item->u.ref_data->disp;
        memcpy (item->u.ref_data->load_addr, &addr, _MIR_type_size (ctx, MIR_T_P));
        continue;
      }
      /* lref data are set up in interpreter or generator */
      if (item->item_type != MIR_expr_data_item) continue;
      expr_item = item->u.expr_data->expr_item;
      MIR_interp (ctx, expr_item, &res, 0);
      type = expr_item->u.func->res_types[0];
      switch (type) {
      case MIR_T_I8:
      case MIR_T_U8: v.i8 = (int8_t) res.i; break;
      case MIR_T_I16:
      case MIR_T_U16: v.i16 = (int16_t) res.i; break;
      case MIR_T_I32:
      case MIR_T_U32: v.i32 = (int32_t) res.i; break;
      case MIR_T_I64:
      case MIR_T_U64: v.i64 = (int64_t) res.i; break;
      case MIR_T_F: v.f = res.f; break;
      case MIR_T_D: v.d = res.d; break;
      case MIR_T_LD: v.ld = res.ld; break;
      case MIR_T_P: v.a = res.a; break;
      default: assert (FALSE); break;
      }
      memcpy (item->u.expr_data->load_addr, &v,
              _MIR_type_size (ctx, expr_item->u.func->res_types[0]));
    }
  }
  if (set_interface != NULL) {
    while (VARR_LENGTH (MIR_module_t, modules_to_link) != 0) {
      m = VARR_POP (MIR_module_t, modules_to_link);
      for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
           item = DLIST_NEXT (MIR_item_t, item))
        if (item->item_type == MIR_func_item) {
          finish_func_interpretation (item); /* in case if it was used for expr data */
          set_interface (ctx, item);
        }
    }
    set_interface (ctx, NULL); /* finish interface setting */
  }
}